

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExecMMU_cpp.h
# Opt level: O0

bool __thiscall moira::Moira::isValidExtMMU(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  uint uVar1;
  u32 uVar2;
  bool local_51;
  anon_class_8_1_3fcf657b local_48;
  anon_class_8_1_3fcf657b validFC;
  anon_class_4_1_ba1d4581 fc;
  anon_class_4_1_ba1d4581 reg;
  anon_class_4_1_ba1d4581 mask;
  anon_class_4_1_ba1d4581 mode;
  anon_class_4_1_ba1d4581 a;
  anon_class_4_1_ba1d4581 preg;
  u32 ext_local;
  u16 op_local;
  Mode M_local;
  Instr I_local;
  Moira *this_local;
  
  local_48.fc = (anon_class_4_1_ba1d4581 *)&validFC;
  validFC.fc._0_4_ = ext;
  validFC.fc._4_4_ = ext;
  fc.ext = ext;
  reg.ext = ext;
  mask.ext = ext;
  mode.ext = ext;
  switch(I) {
  case PFLUSH:
    uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&reg);
    if ((uVar2 == 4) ||
       (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&reg), uVar2 == 6)) {
      uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&reg);
      if ((uVar2 == 6) && ((((M != AI && (M != DI)) && (M != IX)) && ((M != AW && (M != AL)))))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = isValidExtMMU::anon_class_8_1_3fcf657b::operator()(&local_48);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case PFLUSHA:
    local_51 = false;
    if ((op & 0xff) == 0) {
      uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&fc);
      local_51 = false;
      if (uVar2 == 0) {
        uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()
                          ((anon_class_4_1_ba1d4581 *)&validFC);
        local_51 = uVar2 == 0;
      }
    }
    this_local._7_1_ = local_51;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExecMMU_cpp.h"
                  ,0x6e,"bool moira::Moira::isValidExtMMU(Instr, Mode, u16, u32) const");
  case PLOAD:
    if (((M == AI) || (M == DI)) || ((M == IX || ((M == AW || (M == AL)))))) {
      this_local._7_1_ = isValidExtMMU::anon_class_8_1_3fcf657b::operator()(&local_48);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case PMOVE:
    if (((ext & 0x200) == 0) || (((M != DIPC && (M != IXPC)) && (M != IM)))) {
      if (M == IP) {
        this_local._7_1_ = false;
      }
      else {
        uVar1 = ext >> 0xd & 7;
        if (uVar1 == 0) {
          uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&mode);
          if ((uVar2 == 2) ||
             (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&mode), uVar2 == 3)) {
            if ((ext & 0x300) == 0x300) {
              this_local._7_1_ = false;
            }
            else {
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else if (uVar1 == 2) {
          if ((ext & 0x300) == 0x300) {
            this_local._7_1_ = false;
          }
          else if ((((ext & 0x300) == 0) &&
                   (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&mode), uVar2 != 0))
                  && ((M == PI || (((M == PD || (M == IM)) || (M == IP)))))) {
            this_local._7_1_ = false;
          }
          else if ((((ext & 0x100) == 0) &&
                   (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&mode), uVar2 != 0))
                  && ((M == DN || (M == AN)))) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else if (uVar1 == 3) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case PTEST:
    uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()(&mask);
    if ((uVar2 == 0) &&
       (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()
                          ((anon_class_4_1_ba1d4581 *)((long)&validFC.fc + 4)), uVar2 != 0)) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()
                        ((anon_class_4_1_ba1d4581 *)&validFC);
      if (((uVar2 & 0x18) == 0) &&
         (uVar2 = isValidExtMMU::anon_class_4_1_ba1d4581::operator()
                            ((anon_class_4_1_ba1d4581 *)&validFC), (uVar2 & 6) != 0)) {
        this_local._7_1_ = false;
      }
      else if ((((M == AI) || (M == DI)) || (M == IX)) || ((M == AW || (M == AL)))) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Moira::isValidExtMMU(Instr I, Mode M, u16 op, u32 ext) const
{
    auto preg  = [ext]() { return ext >> 10 & 0b111;   };
    auto a     = [ext]() { return ext >>  8 & 0b1;     };
    auto mode  = [ext]() { return ext >> 10 & 0b111;   };
    auto mask  = [ext]() { return ext >>  5 & 0b1111;  }; // 68851 mask is 4 bit
    auto reg   = [ext]() { return ext >>  5 & 0b111;   };
    auto fc    = [ext]() { return ext       & 0b11111; };

    auto validFC = [&]() {
        return fc() <= 1 || (fc() >= 8); // Binutils checks M68851
    };

    switch (I) {

        case Instr::PFLUSHA:

            return (op & 0xFF) == 0 && mask() == 0 && fc() == 0;

        case Instr::PFLUSH:

            // Check mode
            if (mode() != 0b100 && mode() != 0b110) return false;

            // Check EA mode
            if (mode() == 0b110) {
                if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) {
                    return false;
                }
            }
            return validFC();

        case Instr::PLOAD:

            // Check EA mode
            if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) {
                return false;
            }

            return validFC();

        case Instr::PMOVE:

            if ((ext & 0x200)) {
                if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM) return false;
            }
            if (M == Mode::IP) return false;

            switch (ext >> 13 & 0b111) {

                case 0b000:

                    // Check register field
                    if (preg() != 0b010 && preg() != 0b011) return false;

                    // If memory is written, flushing is mandatory
                    if ((ext & 0x300) == 0x300) return false;
                    return true;

                case 0b010:

                    // If memory is written, flushing is mandatory
                    if ((ext & 0x300) == 0x300) return false;

                    if ((ext & 0x300) == 0) {
                        if (preg() != 0) {
                            if (M == Mode::PI || M == Mode::PD || M == Mode::IM || M == Mode::IP) return false;
                        }
                    }

                    // Check register field (binutils accepts all M68851 registers)
                    if ((ext & 0x100) == 0) {
                        if (preg() != 0) {
                            if (M == Mode::DN || M == Mode::AN) return false;
                        }
                    }
                    return true;

                case 0b011:

                    return true;

                default:
                    return false;
            }
            break;

        case Instr::PTEST:

            // When A is 0, reg must be 0
            if (a() == 0 && reg() != 0) return false;

            // Check FC
            if ((fc() & 0b11000) == 0 && (fc() & 0b110) != 0) return false;

            // Check EA mode
            if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) return false;

            return true;

        default:
            fatalError;
    }
}